

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_78::BinaryReaderIR::OnI32ConstExpr(BinaryReaderIR *this,uint32_t value)

{
  Location local_98;
  Const local_78;
  unique_ptr<wabt::ConstExpr,_std::default_delete<wabt::ConstExpr>_> local_30;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_28;
  uint32_t local_1c;
  BinaryReaderIR *pBStack_18;
  uint32_t value_local;
  BinaryReaderIR *this_local;
  
  local_1c = value;
  pBStack_18 = this;
  GetLocation(&local_98,this);
  Const::I32(&local_78,value,&local_98);
  MakeUnique<wabt::ConstExpr,wabt::Const>((wabt *)&local_30,&local_78);
  std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
  unique_ptr<wabt::ConstExpr,std::default_delete<wabt::ConstExpr>,void>
            ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_28,&local_30);
  this_local._4_4_ = AppendExpr(this,&local_28);
  std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_28);
  std::unique_ptr<wabt::ConstExpr,_std::default_delete<wabt::ConstExpr>_>::~unique_ptr(&local_30);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::OnI32ConstExpr(uint32_t value) {
  return AppendExpr(MakeUnique<ConstExpr>(Const::I32(value, GetLocation())));
}